

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators,
          bool includeNamesWithPlatform)

{
  undefined8 globalGenerator;
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  reference ppcVar4;
  size_type *this_00;
  const_reference pvVar5;
  string local_3c8;
  undefined1 local_3a8 [8];
  GeneratorInfo info_2;
  string *a;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [8];
  GeneratorInfo info_1;
  string *gen_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genList;
  cmExternalMakefileProjectGeneratorFactory *eg;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RegisteredExtraGeneratorsVector *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  undefined1 local_148 [8];
  GeneratorInfo info;
  string *name;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *gen;
  const_iterator __end1;
  const_iterator __begin1;
  RegisteredGeneratorsVector *__range1;
  bool includeNamesWithPlatform_local;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators_local;
  cmake *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
           ::begin(&this->Generators);
  gen = (unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *)
        std::
        vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ::end(&this->Generators);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_*,_std::vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>_>
                                *)&gen);
    if (!bVar1) break;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_*,_std::vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>_>
                  ::operator*(&__end1);
    pcVar3 = std::
             unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>::
             operator->((unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                         *)names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*pcVar3->_vptr_cmGlobalGeneratorFactory[4])(local_58);
    if (includeNamesWithPlatform) {
      pcVar3 = std::
               unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
               ::operator->((unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                             *)names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (*pcVar3->_vptr_cmGlobalGeneratorFactory[5])(&local_70);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58,&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70);
    }
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58);
    name = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&name);
      if (!bVar1) break;
      info._160_8_ = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end2);
      GeneratorInfo::GeneratorInfo((GeneratorInfo *)local_148);
      pcVar3 = std::
               unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
               ::operator->((unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                             *)names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar2 = (*pcVar3->_vptr_cmGlobalGeneratorFactory[6])();
      info.extraName.field_2._M_local_buf[8] = (byte)iVar2 & 1;
      pcVar3 = std::
               unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
               ::operator->((unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                             *)names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar2 = (*pcVar3->_vptr_cmGlobalGeneratorFactory[7])();
      info.extraName.field_2._M_local_buf[9] = (byte)iVar2 & 1;
      pcVar3 = std::
               unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
               ::operator->((unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                             *)names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (*pcVar3->_vptr_cmGlobalGeneratorFactory[8])(&local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&info.supportsToolset,&local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_160);
      pcVar3 = std::
               unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
               ::operator->((unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                             *)names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (*pcVar3->_vptr_cmGlobalGeneratorFactory[9])(&__range1_1);
      std::__cxx11::string::operator=
                ((string *)
                 &info.supportedPlatforms.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&__range1_1);
      std::__cxx11::string::~string((string *)&__range1_1);
      std::__cxx11::string::operator=((string *)local_148,(string *)info._160_8_);
      std::__cxx11::string::operator=
                ((string *)(info.name.field_2._M_local_buf + 8),(string *)info._160_8_);
      info.defaultPlatform.field_2._M_local_buf[8] = '\0';
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,(value_type *)local_148);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_148);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_*,_std::vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ::begin(&this->ExtraGenerators);
  eg = (cmExternalMakefileProjectGeneratorFactory *)
       std::
       vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
       ::end(&this->ExtraGenerators);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
                        *)&eg);
    if (!bVar1) break;
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
              ::operator*(&__end1_1);
    genList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar4;
    cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2_1,
               (cmExternalMakefileProjectGeneratorFactory *)
               genList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_1);
    gen_1 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2_1);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&gen_1);
      if (!bVar1) break;
      info_1._160_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2_1);
      GeneratorInfo::GeneratorInfo((GeneratorInfo *)local_280);
      globalGenerator = info_1._160_8_;
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
                (&local_2c0,
                 (cmExternalMakefileProjectGeneratorFactory *)
                 genList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                (&local_2a0,(string *)globalGenerator,&local_2c0);
      std::__cxx11::string::operator=((string *)local_280,(string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::operator=
                ((string *)(info_1.name.field_2._M_local_buf + 8),(string *)info_1._160_8_);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
                ((string *)&__range2_2,
                 (cmExternalMakefileProjectGeneratorFactory *)
                 genList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator=
                ((string *)(info_1.baseName.field_2._M_local_buf + 8),(string *)&__range2_2);
      std::__cxx11::string::~string((string *)&__range2_2);
      info_1.extraName.field_2._M_local_buf[9] = '\0';
      info_1.extraName.field_2._M_local_buf[8] = '\0';
      info_1.defaultPlatform.field_2._M_local_buf[8] = '\0';
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,(value_type *)local_280);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_280);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    this_00 = &(genList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_string_length;
    __end2_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_00);
    a = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_2,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&a);
      if (!bVar1) break;
      info_2._160_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2_2);
      GeneratorInfo::GeneratorInfo((GeneratorInfo *)local_3a8);
      std::__cxx11::string::operator=((string *)local_3a8,(string *)info_2._160_8_);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2_1);
      if (!bVar1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2_1,0);
        std::__cxx11::string::operator=
                  ((string *)(info_2.name.field_2._M_local_buf + 8),(string *)pvVar5);
      }
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
                (&local_3c8,
                 (cmExternalMakefileProjectGeneratorFactory *)
                 genList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator=
                ((string *)(info_2.baseName.field_2._M_local_buf + 8),(string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      info_2.extraName.field_2._M_local_buf[9] = '\0';
      info_2.extraName.field_2._M_local_buf[8] = '\0';
      info_2.defaultPlatform.field_2._M_local_buf[8] = '\x01';
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,(value_type *)local_3a8);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_3a8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_1);
    __gnu_cxx::
    __normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(std::vector<GeneratorInfo>& generators,
                                    bool includeNamesWithPlatform) const
{
  for (const auto& gen : this->Generators) {
    std::vector<std::string> names = gen->GetGeneratorNames();

    if (includeNamesWithPlatform) {
      cm::append(names, gen->GetGeneratorNamesWithPlatform());
    }

    for (std::string const& name : names) {
      GeneratorInfo info;
      info.supportsToolset = gen->SupportsToolset();
      info.supportsPlatform = gen->SupportsPlatform();
      info.supportedPlatforms = gen->GetKnownPlatforms();
      info.defaultPlatform = gen->GetDefaultPlatformName();
      info.name = name;
      info.baseName = name;
      info.isAlias = false;
      generators.push_back(std::move(info));
    }
  }

  for (cmExternalMakefileProjectGeneratorFactory* eg : this->ExtraGenerators) {
    const std::vector<std::string> genList =
      eg->GetSupportedGlobalGenerators();
    for (std::string const& gen : genList) {
      GeneratorInfo info;
      info.name = cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
        gen, eg->GetName());
      info.baseName = gen;
      info.extraName = eg->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = false;
      generators.push_back(std::move(info));
    }
    for (std::string const& a : eg->Aliases) {
      GeneratorInfo info;
      info.name = a;
      if (!genList.empty()) {
        info.baseName = genList.at(0);
      }
      info.extraName = eg->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = true;
      generators.push_back(std::move(info));
    }
  }
}